

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d4c.cc
# Opt level: O0

void sptk::world::anon_unknown_1::InitializeAperiodicity
               (int f0_length,int fft_size,double **aperiodicity)

{
  int j;
  int i;
  double **aperiodicity_local;
  int fft_size_local;
  int f0_length_local;
  
  for (i = 0; i < f0_length; i = i + 1) {
    for (j = 0; j < fft_size / 2 + 1; j = j + 1) {
      aperiodicity[i][j] = 0.999999999999;
    }
  }
  return;
}

Assistant:

static void InitializeAperiodicity(int f0_length, int fft_size,
    double **aperiodicity) {
  for (int i = 0; i < f0_length; ++i)
    for (int j = 0; j < fft_size / 2 + 1; ++j)
      aperiodicity[i][j] = 1.0 - world::kMySafeGuardMinimum;
}